

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::create(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint source;
  allocator<char> local_41;
  string name;
  
  bl(this);
  word(this);
  count(this);
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  source = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  if (uVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"CREATE: could not parse name",&local_41);
    throwCppExceptionMessage(this,&name,errorParsedStringOverflow);
    std::__cxx11::string::~string((string *)&name);
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  assignStringFromCaddress(this,&name,source,(ulong)uVar1);
  definePrimitive(this,name._M_dataplus._M_p,0x1185e0,false);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void create() {
			alignDataPointer();
			bl();
			word(); 
			count();
			auto length = SIZE_T(dStack.getTop()); pop();
			auto caddr = CADDR(dStack.getTop()); pop();

			RUNTIME_ERROR_IF(length < 1, "CREATE: could not parse name",errorParsedStringOverflow);
			std::string name{};
			assignStringFromCaddress(name, CADDR(caddr), length);
			definePrimitive(name.c_str(), &Forth::doCreate, false);
		}